

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O0

char * fy_token_get_direct_output(fy_token *fyt,size_t *sizep)

{
  fy_atom *atom;
  size_t sVar1;
  fy_atom *fya;
  size_t *sizep_local;
  fy_token *fyt_local;
  
  atom = fy_token_atom(fyt);
  if ((((atom == (fy_atom *)0x0) || ((*(uint *)&atom->field_0x34 >> 10 & 1) == 0)) ||
      (fyt->type == FYTT_TAG)) || (fyt->type == FYTT_TAG_DIRECTIVE)) {
    *sizep = 0;
    fyt_local = (fy_token *)0x0;
  }
  else {
    sVar1 = fy_atom_size(atom);
    *sizep = sVar1;
    fyt_local = (fy_token *)fy_atom_data(atom);
  }
  return (char *)fyt_local;
}

Assistant:

const char *fy_token_get_direct_output(struct fy_token *fyt, size_t *sizep) {
    const struct fy_atom *fya;

    fya = fy_token_atom(fyt);
    if (!fya || !fya->direct_output ||
        (fyt->type == FYTT_TAG || fyt->type == FYTT_TAG_DIRECTIVE)) {
        *sizep = 0;
        return NULL;
    }
    *sizep = fy_atom_size(fya);
    return fy_atom_data(fya);
}